

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.h
# Opt level: O1

bool __thiscall Gluco::DoubleOption::parse(DoubleOption *this,char *str)

{
  char *pcVar1;
  double dVar2;
  char cVar3;
  char *pcVar4;
  undefined1 extraout_AL;
  long lVar5;
  char *pcVar6;
  char **ppcVar7;
  bool bVar8;
  double dVar9;
  char *end;
  char *local_20;
  
  if (*str != '-') {
    return false;
  }
  pcVar6 = str + (*str == '-');
  pcVar4 = (this->super_Option).name;
  cVar3 = *pcVar4;
  bVar8 = cVar3 == '\0';
  if (bVar8) {
    lVar5 = 0;
LAB_005c1b2f:
    pcVar6 = pcVar6 + lVar5;
  }
  else if (*pcVar6 == cVar3) {
    lVar5 = 1;
    do {
      cVar3 = pcVar4[lVar5];
      bVar8 = cVar3 == '\0';
      if (bVar8) goto LAB_005c1b2f;
      pcVar1 = pcVar6 + lVar5;
      lVar5 = lVar5 + 1;
    } while (*pcVar1 == cVar3);
  }
  else {
    bVar8 = false;
  }
  if (!bVar8) {
    return false;
  }
  if (*pcVar6 != '=') {
    return false;
  }
  dVar9 = strtod(pcVar6 + (*pcVar6 == '='),&local_20);
  bVar8 = local_20 != (char *)0x0;
  if (!bVar8) {
    return bVar8;
  }
  ppcVar7 = &(this->super_Option).name;
  dVar2 = (this->range).end;
  if (dVar2 <= dVar9) {
    if ((this->range).end_inclusive == true) {
      if ((dVar9 == dVar2) && (!NAN(dVar9) && !NAN(dVar2))) goto LAB_005c1b83;
    }
    parse();
  }
  else {
LAB_005c1b83:
    dVar2 = (this->range).begin;
    if (dVar2 < dVar9) {
LAB_005c1b9e:
      this->value = dVar9;
      return bVar8;
    }
    if ((this->range).begin_inclusive == true) {
      if ((dVar9 == dVar2) && (!NAN(dVar9) && !NAN(dVar2))) goto LAB_005c1b9e;
    }
  }
  parse();
  operator_delete(ppcVar7,0x38);
  return (bool)extraout_AL;
}

Assistant:

DoubleOption(const char* c, const char* n, const char* d, double def = double(), DoubleRange r = DoubleRange(-HUGE_VAL, false, HUGE_VAL, false))
        : Option(n, d, c, "<double>"), range(r), value(def) {
        // FIXME: set LC_NUMERIC to "C" to make sure that strtof/strtod parses decimal point correctly.
    }